

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
cmsys::CommandLineArguments::AddCallback
          (CommandLineArguments *this,char *argument,ArgumentTypeEnum type,CallbackType callback,
          void *call_data,char *help)

{
  Internal *pIVar1;
  mapped_type *__dest;
  String local_90;
  char *local_70;
  CommandLineArgumentsCallbackStructure s;
  char *help_local;
  void *call_data_local;
  CallbackType callback_local;
  ArgumentTypeEnum type_local;
  char *argument_local;
  CommandLineArguments *this_local;
  
  s.Variable._0_4_ = 0;
  s.CallData = (void *)0x0;
  pIVar1 = this->Internals;
  local_70 = argument;
  s.Argument._0_4_ = type;
  s._8_8_ = callback;
  s.Callback = (CallbackType)call_data;
  s._40_8_ = help;
  s.Help = help;
  String::String(&local_90,argument);
  __dest = std::
           map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
           ::operator[](&(pIVar1->Callbacks).
                         super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                        ,&local_90);
  memcpy(__dest,&local_70,0x38);
  String::~String(&local_90);
  GenerateHelp(this);
  return;
}

Assistant:

void CommandLineArguments::AddCallback(const char* argument,
                                       ArgumentTypeEnum type,
                                       CallbackType callback, void* call_data,
                                       const char* help)
{
  CommandLineArgumentsCallbackStructure s;
  s.Argument = argument;
  s.ArgumentType = type;
  s.Callback = callback;
  s.CallData = call_data;
  s.VariableType = CommandLineArguments::NO_VARIABLE_TYPE;
  s.Variable = KWSYS_NULLPTR;
  s.Help = help;

  this->Internals->Callbacks[argument] = s;
  this->GenerateHelp();
}